

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>::reject
          (AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead>
           *this,Exception *exception)

{
  ExceptionOr<unsigned_long> EStack_188;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&EStack_188,exception);
    EStack_188.value.ptr.isSet = false;
    ExceptionOr<unsigned_long>::operator=(&this->result,&EStack_188);
    NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&EStack_188);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }